

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<unsigned_long> *values)

{
  RepeatedField<unsigned_long> *this;
  bool bVar1;
  int iVar2;
  char local_49;
  int local_44;
  int elements_already_reserved;
  unsigned_long value;
  RepeatedField<unsigned_long> *values_local;
  CodedInputStream *input_local;
  uint32 tag_local;
  int param_0_local;
  RepeatedField<unsigned_long> *local_18;
  char local_9;
  
  value = (unsigned_long)values;
  values_local = (RepeatedField<unsigned_long> *)input;
  input_local._0_4_ = tag;
  input_local._4_4_ = param_1;
  bVar1 = ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                    (input,(uint64 *)&stack0xffffffffffffffc0);
  if (bVar1) {
    RepeatedField<unsigned_long>::Add
              ((RepeatedField<unsigned_long> *)value,(unsigned_long *)&stack0xffffffffffffffc0);
    local_44 = RepeatedField<unsigned_long>::Capacity((RepeatedField<unsigned_long> *)value);
    iVar2 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)value);
    local_44 = local_44 - iVar2;
    while( true ) {
      this = values_local;
      local_49 = '\0';
      if (0 < local_44) {
        local_18 = values_local;
        param_0_local = (uint32)input_local;
        if ((uint32)input_local < 0x80) {
          if ((*(Rep **)values_local < values_local->rep_) &&
             (**(byte **)values_local == (uint32)input_local)) {
            io::CodedInputStream::Advance((CodedInputStream *)values_local,1);
            local_9 = '\x01';
          }
          else {
            local_9 = '\0';
          }
        }
        else if ((uint32)input_local < 0x4000) {
          iVar2 = io::CodedInputStream::BufferSize((CodedInputStream *)values_local);
          if (((iVar2 < 2) || ((uint)**(byte **)this != (param_0_local & 0xffU | 0x80))) ||
             ((uint)*(byte *)(*(long *)this + 1) != ((uint)param_0_local >> 7 & 0xff))) {
            local_9 = '\0';
          }
          else {
            io::CodedInputStream::Advance((CodedInputStream *)this,2);
            local_9 = '\x01';
          }
        }
        else {
          local_9 = '\0';
        }
        local_49 = local_9;
      }
      if (local_49 == '\0') {
        return true;
      }
      bVar1 = ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                        ((CodedInputStream *)values_local,(uint64 *)&stack0xffffffffffffffc0);
      if (!bVar1) break;
      RepeatedField<unsigned_long>::AddAlreadyReserved
                ((RepeatedField<unsigned_long> *)value,(unsigned_long *)&stack0xffffffffffffffc0);
      local_44 = local_44 + -1;
    }
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}